

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::ZoneHashBase::reset(ZoneHashBase *this,ZoneHeap *heap)

{
  Slot *p;
  ZoneHeap *this_00;
  uint uVar1;
  size_t in_RDX;
  
  p = (Slot *)this->_data;
  if (p != (Slot *)this->_embedded) {
    this_00 = this->_heap;
    if (this_00->_zone == (Zone *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                 ,0x1af,"isInitialized()");
    }
    if (p == (Slot *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                 ,0x1b1,"p != nullptr");
    }
    uVar1 = this->_bucketsCount;
    if (uVar1 == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                 ,0x1b2,"size != 0");
    }
    if (uVar1 < 0x41) {
      if (uVar1 < 0x11) {
        uVar1 = (uint)((ulong)uVar1 * 8 + 0x1fffffffff >> 5);
      }
      else {
        uVar1 = (int)((ulong)uVar1 * 8 + 0x3fffffff7f >> 6) + 4;
      }
      p->next = this_00->_slots[uVar1];
      this_00->_slots[uVar1] = p;
    }
    else {
      ZoneHeap::_releaseDynamic(this_00,p,in_RDX);
    }
  }
  this->_heap = heap;
  this->_size = 0;
  this->_bucketsCount = 1;
  this->_bucketsGrow = 1;
  this->_data = this->_embedded;
  this->_embedded[0] = (ZoneHashNode *)0x0;
  return;
}

Assistant:

void ZoneHashBase::reset(ZoneHeap* heap) noexcept {
  ZoneHashNode** oldData = _data;
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _heap = heap;
  _size = 0;
  _bucketsCount = 1;
  _bucketsGrow = 1;
  _data = _embedded;
  _embedded[0] = nullptr;
}